

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O2

void cleanup_quest(void)

{
  quest *pqVar1;
  quest_artifact *pqVar2;
  quest_place *pqVar3;
  quest *p;
  quest_place *p_00;
  quest_artifact *p_01;
  
  p = quests;
  while (p != (quest *)0x0) {
    p_01 = p->arts;
    p_00 = p->place;
    pqVar1 = p->next;
    string_free(p->name);
    while (p_01 != (quest_artifact *)0x0) {
      pqVar2 = p_01->next;
      mem_free(p_01);
      p_01 = pqVar2;
    }
    while (p_00 != (quest_place *)0x0) {
      pqVar3 = p_00->next;
      mem_free(p_00);
      p_00 = pqVar3;
    }
    mem_free(p);
    p = pqVar1;
  }
  return;
}

Assistant:

static void cleanup_quest(void)
{
	struct quest *quest = quests, *next;

	while (quest) {
		struct quest_artifact *arts = quest->arts, *next_art;
		struct quest_place *place = quest->place, *next_place;
		next = quest->next;
		string_free(quest->name);
		while (arts) {
			next_art = arts->next;
			mem_free(arts);
			arts = next_art;
		}
		while (place) {
			next_place = place->next;
			mem_free(place);
			place = next_place;
		}
		mem_free(quest);
		quest = next;
	}
}